

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_test.cpp
# Opt level: O2

void operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>,viennamath::ct_constant<8l>>
               (rt_expr<viennamath::rt_expression_interface<double>_> *e,
               rt_constant<long,_viennamath::rt_expression_interface<double>_> *t,ct_constant<8L> *u
               ,double t2,double u2)

{
  type local_48;
  double local_28;
  
  viennamath::result_of::
  add<viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>,_false,_true>
  ::instance(&local_48,t,u);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=(e,&local_48);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_48);
  local_28 = t2 + u2;
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>(e,local_28);
  viennamath::result_of::
  add<viennamath::ct_constant<8L>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_true,_false>
  ::instance(&local_48,u,t);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=(e,&local_48);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_48);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>(e,local_28);
  viennamath::result_of::
  subtract<viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>,_false,_true>
  ::instance(&local_48,t,u);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=(e,&local_48);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_48);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>(e,t2 - u2);
  viennamath::result_of::
  subtract<viennamath::ct_constant<8L>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_true,_false>
  ::instance(&local_48,u,t);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=(e,&local_48);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_48);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>(e,u2 - t2);
  viennamath::result_of::
  mult<viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>,_false,_true>
  ::instance(&local_48,t,u);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=(e,&local_48);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_48);
  local_28 = t2 * u2;
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>(e,local_28);
  viennamath::result_of::
  mult<viennamath::ct_constant<8L>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_true,_false>
  ::instance(&local_48,u,t);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=(e,&local_48);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_48);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>(e,local_28);
  viennamath::result_of::
  div<viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_viennamath::ct_constant<8L>,_false,_true>
  ::instance(&local_48,t,u);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=(e,&local_48);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_48);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>(e,t2 / u2);
  viennamath::result_of::
  div<viennamath::ct_constant<8L>,_viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>,_true,_false>
  ::instance(&local_48,u,t);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::operator=(e,&local_48);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_48);
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>(e,u2 / t2);
  return;
}

Assistant:

void operations_test(E & e, T const & t, U const & u, double t2, double u2)
{
  e = t + u; evaluations_test(e, t2 + u2);
  e = u + t; evaluations_test(e, u2 + t2);
  e = t - u; evaluations_test(e, t2 - u2);
  e = u - t; evaluations_test(e, u2 - t2);
  e = t * u; evaluations_test(e, t2 * u2);
  e = u * t; evaluations_test(e, u2 * t2);
  e = t / u; evaluations_test(e, t2 / u2);
  e = u / t; evaluations_test(e, u2 / t2);
}